

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_set_timeouts(tftp_state_data_t *state)

{
  tftp_state_t tVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  CURLcode CVar7;
  
  tVar1 = state->state;
  time(&state->start_time);
  lVar4 = Curl_timeleft(state->conn->data,(timeval *)0x0,tVar1 == TFTP_STATE_START);
  if (lVar4 < 0) {
    Curl_failf(state->conn->data,"Connection time-out");
    CVar7 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar1 == TFTP_STATE_START) {
      uVar5 = (lVar4 + 500U) / 1000;
      state->max_time = state->start_time + uVar5;
      iVar3 = (int)uVar5;
      iVar6 = iVar3 / 5;
      if (iVar3 < 5) {
        iVar6 = 1;
      }
      state->retry_max = iVar6;
      iVar3 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / (long)iVar6)
      ;
      iVar6 = 1;
      if (1 < iVar3) {
        iVar6 = iVar3;
      }
      state->retry_time = iVar6;
    }
    else {
      if (lVar4 == 0) {
        uVar5 = 0xe10;
      }
      else {
        uVar5 = (lVar4 + 500U) / 1000;
      }
      state->max_time = state->start_time + uVar5;
      state->retry_max = (int)uVar5 / 5;
    }
    if (state->retry_max < 3) {
      state->retry_max = 3;
    }
    if (0x32 < state->retry_max) {
      state->retry_max = 0x32;
    }
    CVar7 = CURLE_OK;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    iVar3 = SUB164(auVar2 / SEXT816((long)state->retry_max),0);
    iVar6 = 1;
    if (1 < iVar3) {
      iVar6 = iVar3;
    }
    state->retry_time = iVar6;
    Curl_infof(state->conn->data,"set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
               (ulong)state->state,state->max_time - state->start_time);
    time(&state->rx_time);
  }
  return CVar7;
}

Assistant:

static CURLcode tftp_set_timeouts(tftp_state_data_t *state)
{
  time_t maxtime, timeout;
  long timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  time(&state->start_time);

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->conn->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->conn->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(start) {

    maxtime = (time_t)(timeout_ms + 500) / 1000;
    state->max_time = state->start_time+maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average restart after 5 seconds */
    state->retry_max = (int)timeout/5;

    if(state->retry_max < 1)
      /* avoid division by zero below */
      state->retry_max = 1;

    /* Compute the re-start interval to suit the timeout */
    state->retry_time = (int)timeout/state->retry_max;
    if(state->retry_time<1)
      state->retry_time=1;

  }
  else {
    if(timeout_ms > 0)
      maxtime = (time_t)(timeout_ms + 500) / 1000;
    else
      maxtime = 3600;

    state->max_time = state->start_time+maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average reposting an ACK after 5 seconds */
    state->retry_max = (int)timeout/5;
  }
  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max=3;

  if(state->retry_max>50)
    state->retry_max=50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time=1;

  infof(state->conn->data,
        "set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
        (int)state->state, (long)(state->max_time-state->start_time),
        state->retry_time, state->retry_max);

  /* init RX time */
  time(&state->rx_time);

  return CURLE_OK;
}